

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O1

bool sf::Shader::isAvailable(void)

{
  bool bVar1;
  TransientContextLock contextLock;
  Lock lock;
  TransientContextLock local_11;
  Lock local_10;
  
  Lock::Lock(&local_10,(Mutex *)&(anonymous_namespace)::isAvailableMutex);
  if (isAvailable()::checked == '\0') {
    isAvailable()::checked = '\x01';
    GlResource::TransientContextLock::TransientContextLock(&local_11);
    priv::ensureExtensionsInit();
    isAvailable::available =
         SF_GLAD_GL_ARB_fragment_shader != 0 &&
         ((SF_GLAD_GL_ARB_vertex_shader != 0 && SF_GLAD_GL_ARB_shader_objects != 0) &&
         (SF_GLAD_GL_ARB_shading_language_100 != 0 && SF_GLAD_GL_ARB_multitexture != 0));
    GlResource::TransientContextLock::~TransientContextLock(&local_11);
  }
  bVar1 = isAvailable::available;
  Lock::~Lock(&local_10);
  return bVar1;
}

Assistant:

bool Shader::isAvailable()
{
    Lock lock(isAvailableMutex);

    static bool checked = false;
    static bool available = false;

    if (!checked)
    {
        checked = true;

        TransientContextLock contextLock;

        // Make sure that extensions are initialized
        sf::priv::ensureExtensionsInit();

        available = GLEXT_multitexture         &&
                    GLEXT_shading_language_100 &&
                    GLEXT_shader_objects       &&
                    GLEXT_vertex_shader        &&
                    GLEXT_fragment_shader;
    }

    return available;
}